

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_AigGetLevelizedOrder(Abc_Ntk_t *pNtk,int fCollectCis)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *__s;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x72e,"Vec_Ptr_t *Abc_AigGetLevelizedOrder(Abc_Ntk_t *, int)");
  }
  Abc_NtkCleanCopy(pNtk);
  uVar3 = Abc_AigSetChoiceLevels(pNtk);
  uVar1 = uVar3 + 1;
  uVar4 = 8;
  if (6 < uVar3) {
    uVar4 = uVar1;
  }
  if (uVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar4 << 3);
  }
  memset(__s,0,(long)(int)uVar1 << 3);
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar9 = pVVar6->pArray[lVar5];
      if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 0x14) & 0xf) == 7)) {
        iVar2 = *(int *)((long)pvVar9 + 0x40);
        *(undefined8 *)((long)pvVar9 + 0x40) = *(undefined8 *)((long)__s + (long)iVar2 * 8);
        *(void **)((long)__s + (long)iVar2 * 8) = pvVar9;
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  iVar2 = pNtk->nObjCounts[7];
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar6->pArray = ppvVar7;
  pVVar6->nSize = iVar2;
  memset(ppvVar7,0,(long)iVar2 << 3);
  if ((int)(uint)(fCollectCis == 0) <= (int)uVar3) {
    uVar10 = (ulong)(fCollectCis == 0);
    do {
      pvVar9 = *(void **)((long)__s + uVar10 * 8);
      if (pvVar9 != (void *)0x0) {
        lVar5 = (long)pVVar6->nSize;
        uVar4 = pVVar6->nCap;
        ppvVar7 = pVVar6->pArray;
        do {
          if ((uint)lVar5 == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (ppvVar7 == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(ppvVar7,0x80);
              }
              uVar4 = 0x10;
            }
            else {
              uVar3 = uVar4 * 2;
              if (SBORROW4(uVar4,uVar3) != 0 < (int)uVar4) {
                uVar4 = uVar3;
                if (ppvVar7 == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar3 << 3);
                }
                else {
                  ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar3 << 3);
                }
              }
            }
          }
          ppvVar7[lVar5] = pvVar9;
          lVar5 = lVar5 + 1;
          pvVar9 = *(void **)((long)pvVar9 + 0x40);
        } while (pvVar9 != (void *)0x0);
        pVVar6->nSize = (int)lVar5;
        pVVar6->nCap = uVar4;
        pVVar6->pArray = ppvVar7;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Abc_AigGetLevelizedOrder( Abc_Ntk_t * pNtk, int fCollectCis )
{
    Vec_Ptr_t * vNodes, * vLevels;
    Abc_Obj_t * pNode, ** ppHead;
    int LevelMax, i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the correct levels
    Abc_NtkCleanCopy( pNtk );
    LevelMax = Abc_AigSetChoiceLevels( pNtk );
    // relink nodes by level
    vLevels = Vec_PtrStart( LevelMax + 1 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        ppHead = ((Abc_Obj_t **)vLevels->pArray) + (int)(ABC_PTRINT_T)pNode->pCopy;
        pNode->pCopy = *ppHead;
        *ppHead = pNode;
    }
    // recollect nodes
    vNodes = Vec_PtrStart( Abc_NtkNodeNum(pNtk) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vLevels, pNode, i, !fCollectCis )
        for ( ; pNode; pNode = pNode->pCopy )
            Vec_PtrPush( vNodes, pNode );
    Vec_PtrFree( vLevels );
    return vNodes;
}